

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
SimpleLogger::LoggerStream::setLogInfo
          (LoggerStream *this,int _level,SimpleLogger *_logger,char *_file,char *_func,size_t _line)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  string local_50 [32];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::string::string(local_50);
  std::__cxx11::stringstream::str((string *)(in_RDI + 0x70));
  std::__cxx11::string::~string(local_50);
  *(undefined4 *)(in_RDI + 0x1f8) = local_c;
  *(undefined8 *)(in_RDI + 0x200) = local_18;
  *(undefined8 *)(in_RDI + 0x208) = local_20;
  *(undefined8 *)(in_RDI + 0x210) = local_28;
  *(undefined8 *)(in_RDI + 0x218) = local_30;
  return;
}

Assistant:

inline void setLogInfo(int _level,
                               SimpleLogger* _logger,
                               const char* _file,
                               const char* _func,
                               size_t _line)
        {
            sStream.str(std::string());
            level = _level;
            logger = _logger;
            file = _file;
            func = _func;
            line = _line;
        }